

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_unravel_index(ggml_tensor *tensor,int64_t i,int64_t *i0,int64_t *i1,int64_t *i2,
                       int64_t *i3)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int64_t i0_;
  int64_t i1_;
  int64_t i2_;
  int64_t i3_;
  int64_t ne0;
  int64_t ne1;
  int64_t ne2;
  int64_t *i3_local;
  int64_t *i2_local;
  int64_t *i1_local;
  int64_t *i0_local;
  int64_t i_local;
  ggml_tensor *tensor_local;
  
  lVar1 = tensor->ne[2];
  lVar2 = tensor->ne[1];
  lVar3 = tensor->ne[0];
  lVar4 = i / (lVar1 * lVar2 * lVar3);
  lVar5 = (i - lVar4 * lVar1 * lVar2 * lVar3) / (lVar2 * lVar3);
  lVar6 = ((i - lVar4 * lVar1 * lVar2 * lVar3) - lVar5 * lVar2 * lVar3) / lVar3;
  if (i0 != (int64_t *)0x0) {
    *i0 = ((i - lVar4 * lVar1 * lVar2 * lVar3) - lVar5 * lVar2 * lVar3) - lVar6 * lVar3;
  }
  if (i1 != (int64_t *)0x0) {
    *i1 = lVar6;
  }
  if (i2 != (int64_t *)0x0) {
    *i2 = lVar5;
  }
  if (i3 != (int64_t *)0x0) {
    *i3 = lVar4;
  }
  return;
}

Assistant:

void ggml_unravel_index(const struct ggml_tensor * tensor, int64_t i, int64_t * i0, int64_t * i1, int64_t * i2, int64_t * i3) {
    const int64_t ne2 = tensor->ne[2];
    const int64_t ne1 = tensor->ne[1];
    const int64_t ne0 = tensor->ne[0];

    const int64_t i3_ = (i/(ne2*ne1*ne0));
    const int64_t i2_ = (i - i3_*ne2*ne1*ne0)/(ne1*ne0);
    const int64_t i1_ = (i - i3_*ne2*ne1*ne0 - i2_*ne1*ne0)/ne0;
    const int64_t i0_ = (i - i3_*ne2*ne1*ne0 - i2_*ne1*ne0 - i1_*ne0);

    if (i0) {
        * i0 = i0_;
    }
    if (i1) {
        * i1 = i1_;
    }
    if (i2) {
        * i2 = i2_;
    }
    if (i3) {
        * i3 = i3_;
    }
}